

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loc.c
# Opt level: O1

int dwarf_get_location_op_value_c
              (Dwarf_Locdesc_c_conflict locdesc,Dwarf_Unsigned index,Dwarf_Small *atom_out,
              Dwarf_Unsigned *operand1,Dwarf_Unsigned *operand2,Dwarf_Unsigned *operand3,
              Dwarf_Unsigned *offset_for_branch,Dwarf_Error *error)

{
  Dwarf_Loc_Expr_Op_conflict pDVar1;
  
  if (locdesc == (Dwarf_Locdesc_c_conflict)0x0) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULLDwarf_Locdesc_c_Head_c NULL in calling dwarf_get_location_op_value_c()"
                       );
  }
  else {
    if (index < locdesc->ld_cents) {
      pDVar1 = locdesc->ld_s;
      *atom_out = pDVar1[index].lr_atom;
      *operand1 = pDVar1[index].lr_number;
      *operand2 = pDVar1[index].lr_number2;
      *operand3 = pDVar1[index].lr_number3;
      *offset_for_branch = pDVar1[index].lr_offset;
      return 0;
    }
    _dwarf_error(locdesc->ld_loclist_head->ll_dbg,error,0x138);
  }
  return 1;
}

Assistant:

int
dwarf_get_location_op_value_c(Dwarf_Locdesc_c locdesc,
    Dwarf_Unsigned   index,
    Dwarf_Small    * atom_out,
    Dwarf_Unsigned * operand1,
    Dwarf_Unsigned * operand2,
    Dwarf_Unsigned * operand3,
    Dwarf_Unsigned * offset_for_branch,
    Dwarf_Error*     error)
{
    Dwarf_Loc_Expr_Op op = 0;
    Dwarf_Unsigned max = 0;

    if (!locdesc) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL"
            "Dwarf_Locdesc_c_Head_c NULL "
            "in calling "
            "dwarf_get_location_op_value_c()");
        return DW_DLV_ERROR;
    }
    max = locdesc->ld_cents;
    if (index >= max) {
        Dwarf_Debug dbg = locdesc->ld_loclist_head->ll_dbg;
        _dwarf_error(dbg, error, DW_DLE_LOCLIST_INDEX_ERROR);
        return DW_DLV_ERROR;
    }
    op = locdesc->ld_s + index;
    *atom_out = op->lr_atom;
    *operand1 = op->lr_number;
    *operand2 = op->lr_number2;
    *operand3 = op->lr_number3;
    *offset_for_branch = op->lr_offset;
    return DW_DLV_OK;
}